

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O2

int __thiscall kj::Url::clone(Url *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  code cVar1;
  code cVar2;
  long lVar3;
  long lVar4;
  QueryParam *pQVar5;
  RemoveConst<kj::Url::QueryParam> *pRVar6;
  ArrayDisposer *pAVar7;
  String *params;
  String *params_00;
  String *extraout_RDX;
  String *extraout_RDX_00;
  String *extraout_RDX_01;
  String *extraout_RDX_02;
  String *pSVar8;
  String *params_01;
  String *extraout_RDX_03;
  String *params_02;
  kj *pkVar9;
  ArrayBuilder<kj::Url::QueryParam> builder_1;
  ArrayBuilder<kj::String> builder;
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 local_138;
  Array<kj::String> result;
  ArrayBuilder<kj::Url::QueryParam> local_f8;
  ArrayBuilder<kj::String> local_d8;
  Array<kj::Url::QueryParam> result_1;
  Array<char> local_a0;
  Array<char> local_88;
  NullableValue<kj::Url::UserInfo> local_70;
  
  str<kj::String_const&>((String *)&local_88,(kj *)__fn,(String *)__child_stack);
  if (__fn[0x18] == (__fn)0x0) {
    local_70.isSet = false;
    pSVar8 = params;
  }
  else {
    str<kj::String_const&>((String *)&builder,(kj *)(__fn + 0x20),params);
    cVar1 = __fn[0x38];
    if (cVar1 == (code)0x1) {
      str<kj::String_const&>((String *)&builder_1,(kj *)(__fn + 0x40),params_00);
      local_138.value.content.ptr = (char *)builder_1.ptr;
      local_138.value.content.size_ = (size_t)builder_1.pos;
      builder_1.ptr = (QueryParam *)0x0;
      builder_1.pos = (RemoveConst<kj::Url::QueryParam> *)0x0;
      Array<char>::~Array((Array<char> *)&builder_1);
    }
    builder.disposer = (ArrayDisposer *)CONCAT71(builder.disposer._1_7_,cVar1 == (code)0x1);
    kj::_::NullableValue<kj::Url::UserInfo>::NullableValue(&local_70,(UserInfo *)&builder);
    UserInfo::~UserInfo((UserInfo *)&builder);
    pSVar8 = extraout_RDX;
  }
  str<kj::String_const&>((String *)&local_a0,(kj *)(__fn + 0x58),pSVar8);
  lVar3 = *(long *)(__fn + 0x78);
  lVar4 = *(long *)(__fn + 0x70);
  builder.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::String>((lVar3 - lVar4) / 0x18);
  builder.endPtr = (String *)((lVar3 - lVar4) + (long)builder.ptr);
  builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pSVar8 = extraout_RDX_00;
  builder.pos = builder.ptr;
  for (pkVar9 = *(kj **)(__fn + 0x70); pkVar9 != *(kj **)(__fn + 0x78); pkVar9 = pkVar9 + 0x18) {
    str<kj::String_const&>((String *)&builder_1,pkVar9,pSVar8);
    ((builder.pos)->content).ptr = (char *)builder_1.ptr;
    ((builder.pos)->content).size_ = (size_t)builder_1.pos;
    ((builder.pos)->content).disposer = (ArrayDisposer *)builder_1.endPtr;
    builder_1.ptr = (QueryParam *)0x0;
    builder_1.pos = (RemoveConst<kj::Url::QueryParam> *)0x0;
    builder.pos = builder.pos + 1;
    Array<char>::~Array((Array<char> *)&builder_1);
    pSVar8 = extraout_RDX_01;
  }
  result.size_ = ((long)builder.pos - (long)builder.ptr) / 0x18;
  result.ptr = builder.ptr;
  result.disposer = builder.disposer;
  builder.ptr = (String *)0x0;
  builder.pos = (RemoveConst<kj::String> *)0x0;
  builder.endPtr = (String *)0x0;
  ArrayBuilder<kj::String>::dispose(&builder);
  local_d8.ptr = result.ptr;
  local_d8.pos = result.ptr + result.size_;
  local_d8.disposer = result.disposer;
  result.ptr = (String *)0x0;
  result.size_ = 0;
  cVar1 = __fn[0x90];
  lVar3 = *(long *)(__fn + 0xa0);
  lVar4 = *(long *)(__fn + 0x98);
  local_d8.endPtr = local_d8.pos;
  builder_1.ptr =
       kj::_::HeapArrayDisposer::allocateUninitialized<kj::Url::QueryParam>((lVar3 - lVar4) / 0x30);
  builder_1.endPtr = (QueryParam *)((lVar3 - lVar4) + (long)builder_1.ptr);
  builder_1.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pSVar8 = extraout_RDX_02;
  builder_1.pos = builder_1.ptr;
  for (pkVar9 = (kj *)(*(long *)(__fn + 0x98) + 0x18); pAVar7 = builder_1.disposer,
      pRVar6 = builder_1.pos, pQVar5 = builder_1.ptr, pkVar9 + -0x18 != *(kj **)(__fn + 0xa0);
      pkVar9 = pkVar9 + 0x30) {
    str<kj::String_const&>((String *)&builder,pkVar9 + -0x18,pSVar8);
    if ((*(long *)(pkVar9 + 8) == 0) || (*(long *)pkVar9 == 0)) {
      builder.disposer = (ArrayDisposer *)0x0;
      local_138.value.content.ptr = (char *)0x0;
      local_138.value.content.size_ = 0;
    }
    else {
      str<kj::String_const&>((String *)&builder.disposer,pkVar9,params_01);
    }
    ((builder_1.pos)->name).content.ptr = (char *)builder.ptr;
    ((builder_1.pos)->name).content.size_ = (size_t)builder.pos;
    builder.ptr = (String *)0x0;
    builder.pos = (RemoveConst<kj::String> *)0x0;
    ((builder_1.pos)->name).content.disposer = (ArrayDisposer *)builder.endPtr;
    ((builder_1.pos)->value).content.ptr = (char *)builder.disposer;
    ((builder_1.pos)->value).content.size_ = (size_t)local_138.value.content.ptr;
    ((builder_1.pos)->value).content.disposer = (ArrayDisposer *)local_138.value.content.size_;
    builder.disposer = (ArrayDisposer *)0x0;
    local_138.value.content.ptr = (char *)0x0;
    builder_1.pos = builder_1.pos + 1;
    QueryParam::~QueryParam((QueryParam *)&builder);
    pSVar8 = extraout_RDX_03;
  }
  result_1.disposer = builder_1.disposer;
  builder_1.ptr = (QueryParam *)0x0;
  builder_1.pos = (RemoveConst<kj::Url::QueryParam> *)0x0;
  builder_1.endPtr = (QueryParam *)0x0;
  ArrayBuilder<kj::Url::QueryParam>::dispose(&builder_1);
  local_f8.ptr = pQVar5;
  local_f8.pos = pRVar6;
  local_f8.endPtr = pRVar6;
  local_f8.disposer = pAVar7;
  result_1.ptr = (QueryParam *)0x0;
  result_1.size_ = 0;
  cVar2 = __fn[0xb8];
  if (cVar2 == (code)0x1) {
    str<kj::String_const&>((String *)&builder_1,(kj *)(__fn + 0xc0),params_02);
    builder.pos = &(builder_1.ptr)->name;
    builder.endPtr = &(builder_1.pos)->name;
    builder.disposer = (ArrayDisposer *)builder_1.endPtr;
    builder_1.ptr = (QueryParam *)0x0;
    builder_1.pos = (RemoveConst<kj::Url::QueryParam> *)0x0;
    Array<char>::~Array((Array<char> *)&builder_1);
  }
  builder.ptr = (String *)CONCAT71(builder.ptr._1_7_,cVar2 == (code)0x1);
  Url(this,(String *)&local_88,(Maybe<kj::Url::UserInfo> *)&local_70,(String *)&local_a0,
      (Vector<kj::String> *)&local_d8,(bool)cVar1,(Vector<kj::Url::QueryParam> *)&local_f8,
      (Maybe<kj::String> *)&builder,SUB42(*(undefined4 *)(__fn + 0xd8),0));
  kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)&builder);
  ArrayBuilder<kj::Url::QueryParam>::dispose(&local_f8);
  Array<kj::Url::QueryParam>::~Array(&result_1);
  ArrayBuilder<kj::String>::dispose(&local_d8);
  Array<kj::String>::~Array(&result);
  Array<char>::~Array(&local_a0);
  kj::_::NullableValue<kj::Url::UserInfo>::~NullableValue(&local_70);
  Array<char>::~Array(&local_88);
  return (int)this;
}

Assistant:

Url Url::clone() const {
  return {
    kj::str(scheme),
    userInfo.map([](const UserInfo& ui) -> UserInfo {
      return {
        kj::str(ui.username),
        ui.password.map([](const String& s) { return kj::str(s); })
      };
    }),
    kj::str(host),
    KJ_MAP(part, path) { return kj::str(part); },
    hasTrailingSlash,
    KJ_MAP(param, query) -> QueryParam {
      // Preserve the "allocated-ness" of `param.value` with this careful copy.
      return { kj::str(param.name), param.value.begin() == nullptr ? kj::String()
                                                                   : kj::str(param.value) };
    },
    fragment.map([](const String& s) { return kj::str(s); }),
    options
  };
}